

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaC_step(lua_State *L)

{
  global_State *pgVar1;
  global_State *g_00;
  global_State *pgVar2;
  ulong osize;
  UpVal *pUVar3;
  Node *pNVar4;
  TValue *pTVar5;
  uint uVar6;
  int iVar7;
  GCObject **ppGVar8;
  char *pcVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  lu_mem lVar13;
  long lVar14;
  GCObject *pGVar15;
  global_State *g;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  
  pgVar1 = L->l_G;
  uVar6 = pgVar1->gcstepmul * 10;
  uVar16 = 0x7ffffffffffffffe;
  if (uVar6 != 0) {
    uVar16 = (ulong)uVar6;
  }
  pgVar1->gcdept = pgVar1->gcdept + (pgVar1->totalbytes - pgVar1->GCthreshold);
  do {
    g_00 = L->l_G;
    switch(g_00->gcstate) {
    case '\0':
      g_00->weak = (GCObject *)0x0;
      g_00->gray = (GCObject *)0x0;
      g_00->grayagain = (GCObject *)0x0;
      pGVar15 = (GCObject *)g_00->mainthread;
      if (((pGVar15->gch).marked & 3) != 0) {
        reallymarkobject(g_00,pGVar15);
        pGVar15 = (GCObject *)g_00->mainthread;
      }
      if ((3 < (pGVar15->th).l_gt.tt) &&
         (pGVar15 = (pGVar15->th).l_gt.value.gc, ((pGVar15->gch).marked & 3) != 0)) {
        reallymarkobject(g_00,pGVar15);
      }
      if ((3 < (L->l_G->l_registry).tt) &&
         (pGVar15 = (L->l_G->l_registry).value.gc, ((pGVar15->gch).marked & 3) != 0)) {
        reallymarkobject(g_00,pGVar15);
      }
      markmt(g_00);
      g_00->gcstate = '\x01';
    default:
switchD_001066a2_default:
      lVar10 = 0;
      break;
    case '\x01':
      if (g_00->gray == (GCObject *)0x0) {
        pUVar3 = &g_00->uvhead;
        while (pUVar3 = (pUVar3->u).l.next, pUVar3 != &g_00->uvhead) {
          if ((((pUVar3->marked & 7) == 0) && (3 < pUVar3->v->tt)) &&
             (pGVar15 = (pUVar3->v->value).gc, ((pGVar15->gch).marked & 3) != 0)) {
            reallymarkobject(g_00,pGVar15);
          }
        }
        propagateall(g_00);
        g_00->gray = g_00->weak;
        g_00->weak = (GCObject *)0x0;
        if ((L->marked & 3) != 0) {
          reallymarkobject(g_00,(GCObject *)L);
        }
        markmt(g_00);
        propagateall(g_00);
        g_00->gray = g_00->grayagain;
        g_00->grayagain = (GCObject *)0x0;
        propagateall(g_00);
        sVar11 = luaC_separateudata(L,0);
        pGVar15 = g_00->tmudata;
        if (pGVar15 != (GCObject *)0x0) {
          do {
            pGVar15 = (pGVar15->gch).next;
            (pGVar15->gch).marked = g_00->currentwhite & 3 | (pGVar15->gch).marked & 0xf8;
            reallymarkobject(g_00,pGVar15);
          } while (pGVar15 != g_00->tmudata);
        }
        sVar12 = propagateall(g_00);
        ppGVar8 = &g_00->weak;
        while (pGVar15 = *ppGVar8, pGVar15 != (GCObject *)0x0) {
          if (((pGVar15->gch).marked & 0x10) != 0) {
            lVar17 = (long)(pGVar15->h).sizearray;
            lVar10 = lVar17 << 4;
            while( true ) {
              lVar14 = lVar10;
              bVar18 = lVar17 == 0;
              lVar17 = lVar17 + -1;
              if (bVar18) break;
              pTVar5 = (pGVar15->h).array;
              iVar7 = iscleared((TValue *)((long)&pTVar5[-1].value + lVar14),0);
              lVar10 = lVar14 + -0x10;
              if (iVar7 != 0) {
                *(undefined4 *)((long)&pTVar5[-1].tt + lVar14) = 0;
              }
            }
          }
          lVar17 = (0x100000000 << ((pGVar15->h).lsizenode & 0x3f)) >> 0x20;
          lVar10 = lVar17 * 0x28;
          while( true ) {
            lVar14 = lVar10;
            lVar10 = lVar14 + -0x28;
            bVar18 = lVar17 == 0;
            lVar17 = lVar17 + -1;
            if (bVar18) break;
            pNVar4 = (pGVar15->h).node;
            if (((*(int *)((long)&pNVar4[-1].i_val.tt + lVar14) != 0) &&
                ((iVar7 = iscleared((TValue *)((long)&pNVar4[-1].i_key + lVar14),1), iVar7 != 0 ||
                 (iVar7 = iscleared((TValue *)((long)&pNVar4[-1].i_val.value + lVar14),0),
                 iVar7 != 0)))) &&
               (*(undefined4 *)((long)&pNVar4[-1].i_val.tt + lVar14) = 0,
               3 < *(int *)((long)&pNVar4[-1].i_key + lVar14 + 8))) {
              *(undefined4 *)((long)&pNVar4[-1].i_key + lVar14 + 8) = 0xb;
            }
          }
          ppGVar8 = &(pGVar15->h).gclist;
        }
        g_00->currentwhite = g_00->currentwhite ^ 3;
        g_00->sweepstrgc = 0;
        g_00->sweepgc = &g_00->rootgc;
        g_00->gcstate = '\x02';
        g_00->estimate = g_00->totalbytes - (sVar12 + sVar11);
        lVar10 = 0;
      }
      else {
        lVar10 = propagatemark(g_00);
      }
      break;
    case '\x02':
      lVar13 = g_00->totalbytes;
      iVar7 = g_00->sweepstrgc;
      g_00->sweepstrgc = iVar7 + 1;
      sweeplist(L,(g_00->strt).hash + iVar7,0xfffffffffffffffd);
      if ((g_00->strt).size <= g_00->sweepstrgc) {
        g_00->gcstate = '\x03';
      }
      g_00->estimate = g_00->estimate + (g_00->totalbytes - lVar13);
      lVar10 = 10;
      break;
    case '\x03':
      lVar13 = g_00->totalbytes;
      ppGVar8 = sweeplist(L,g_00->sweepgc,0x28);
      g_00->sweepgc = ppGVar8;
      if (*ppGVar8 == (GCObject *)0x0) {
        pgVar2 = L->l_G;
        uVar6 = (pgVar2->strt).size;
        if ((0x40 < (int)uVar6) && ((pgVar2->strt).nuse < (uint)((int)uVar6 / 4))) {
          luaS_resize(L,uVar6 >> 1);
        }
        osize = (pgVar2->buff).buffsize;
        if (0x40 < osize) {
          pcVar9 = (char *)luaM_realloc_(L,(pgVar2->buff).buffer,osize,osize >> 1);
          (pgVar2->buff).buffer = pcVar9;
          (pgVar2->buff).buffsize = osize >> 1;
        }
        g_00->gcstate = '\x04';
      }
      g_00->estimate = g_00->estimate + (g_00->totalbytes - lVar13);
      lVar10 = 400;
      break;
    case '\x04':
      if (g_00->tmudata == (GCObject *)0x0) {
        g_00->gcstate = '\0';
        g_00->gcdept = 0;
        goto switchD_001066a2_default;
      }
      GCTM(L);
      lVar10 = 100;
      if (100 < g_00->estimate) {
        g_00->estimate = g_00->estimate - 100;
      }
    }
    if ((pgVar1->gcstate == '\0') || (uVar16 = uVar16 - lVar10, (long)uVar16 < 1)) {
      if (pgVar1->gcstate == '\0') {
        lVar13 = (long)pgVar1->gcpause * (pgVar1->estimate / 100);
      }
      else if (pgVar1->gcdept < 0x400) {
        lVar13 = pgVar1->totalbytes + 0x400;
      }
      else {
        pgVar1->gcdept = pgVar1->gcdept - 0x400;
        lVar13 = pgVar1->totalbytes;
      }
      pgVar1->GCthreshold = lVar13;
      return;
    }
  } while( true );
}

Assistant:

static void luaC_step(lua_State*L){
global_State*g=G(L);
l_mem lim=(1024u/100)*g->gcstepmul;
if(lim==0)
lim=(((lu_mem)(~(lu_mem)0)-2)-1)/2;
g->gcdept+=g->totalbytes-g->GCthreshold;
do{
lim-=singlestep(L);
if(g->gcstate==0)
break;
}while(lim>0);
if(g->gcstate!=0){
if(g->gcdept<1024u)
g->GCthreshold=g->totalbytes+1024u;
else{
g->gcdept-=1024u;
g->GCthreshold=g->totalbytes;
}
}
else{
setthreshold(g);
}
}